

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daemonize.cpp
# Opt level: O0

void __thiscall cppcms::impl::daemonizer::daemonize(daemonizer *this,value *conf)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  int iVar4;
  int *piVar5;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  reference __buf;
  size_type __size;
  string *psVar9;
  void *__buf_00;
  size_t __n;
  ssize_t sVar10;
  int *in_RDI;
  int v;
  string pid;
  ostringstream ss;
  int chdir_r;
  int err_11;
  int err_10;
  int err_9;
  int chid;
  int err_8;
  int err_7;
  vector<char,_std::allocator<char>_> buf;
  char *wd;
  string lock_file;
  int err_6;
  int err_5;
  int err_4;
  rlimit lm;
  int fd_limit;
  int err_3;
  int err_2;
  int err_1;
  string chroot_dir;
  passwd *pw;
  string user;
  group *gr;
  string group;
  int err;
  int lock_fd;
  int devnull_fd;
  int uid;
  int gid;
  string *in_stack_fffffffffffff8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8e0;
  allocator *paVar11;
  undefined4 in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8ec;
  allocator_type *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff900;
  value *in_stack_fffffffffffff908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  char *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  value *in_stack_fffffffffffff948;
  string *in_stack_fffffffffffff950;
  int in_stack_fffffffffffff95c;
  cppcms_error *in_stack_fffffffffffff960;
  allocator local_561;
  string local_560 [36];
  int local_53c;
  string local_538 [32];
  locale local_518 [8];
  ostringstream local_510 [376];
  int local_398;
  undefined1 local_392;
  allocator local_391;
  string local_390 [32];
  int local_370;
  undefined1 local_36a;
  allocator local_369;
  string local_368 [32];
  int local_348;
  undefined1 local_342;
  allocator local_341;
  string local_340 [36];
  int local_31c;
  __pid_t local_318;
  undefined1 local_312;
  allocator local_311;
  string local_310 [36];
  int local_2ec;
  string local_2e8 [32];
  string local_2c8 [38];
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0 [32];
  int local_280;
  allocator<char> local_279;
  vector<char,_std::allocator<char>_> local_278;
  char *local_260;
  string local_258 [39];
  undefined1 local_231;
  int local_210;
  undefined1 local_209;
  int local_1e8;
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [36];
  int local_1bc;
  rlimit local_1b8;
  undefined4 local_1a4;
  int local_1a0;
  undefined1 local_199;
  int local_178;
  undefined1 local_171;
  int local_150;
  undefined1 local_14a;
  allocator local_149;
  string local_148 [36];
  int local_124;
  string local_120 [39];
  undefined1 local_f9;
  passwd *local_d8;
  string local_d0 [39];
  undefined1 local_a9;
  group *local_88;
  string local_80 [38];
  undefined1 local_5a;
  allocator local_59;
  string local_58 [32];
  int local_38;
  int local_24;
  int local_20;
  __uid_t local_1c;
  __gid_t local_18;
  undefined1 local_11;
  
  _Var2 = getppid();
  if (_Var2 != 1) {
    local_11 = 0;
    bVar1 = json::value::get<bool>
                      (in_stack_fffffffffffff908,(char *)in_stack_fffffffffffff900,
                       (bool *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_18 = 0xffffffff;
      local_1c = 0xffffffff;
      local_20 = 0xffffffff;
      local_24 = -1;
      local_20 = open("/dev/null",2);
      if (local_20 < 0) {
        piVar5 = __errno_location();
        local_38 = *piVar5;
        local_5a = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_58,"Failed to open /dev/null",&local_59);
        cppcms_error::cppcms_error
                  (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
        local_5a = 0;
        __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      json::value::get_abi_cxx11_
                (in_stack_fffffffffffff948,
                 (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 in_stack_fffffffffffff938);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        local_88 = getgrnam(pcVar8);
        if (local_88 == (group *)0x0) {
          local_a9 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         in_stack_fffffffffffff920);
          cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
          local_a9 = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
        local_18 = local_88->gr_gid;
      }
      json::value::get_abi_cxx11_
                (in_stack_fffffffffffff948,
                 (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 in_stack_fffffffffffff938);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        local_d8 = getpwnam(pcVar8);
        if (local_d8 == (passwd *)0x0) {
          local_f9 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         in_stack_fffffffffffff920);
          cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
          local_f9 = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
        local_1c = local_d8->pw_uid;
        if (local_18 == 0xffffffff) {
          local_18 = local_d8->pw_gid;
        }
      }
      json::value::get_abi_cxx11_
                (in_stack_fffffffffffff948,
                 (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 in_stack_fffffffffffff938);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        global_urandom_fd = open("/dev/urandom",0);
        if (global_urandom_fd < 0) {
          piVar5 = __errno_location();
          local_124 = *piVar5;
          local_14a = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_148,"Failed to open /dev/urandom",&local_149);
          cppcms_error::cppcms_error
                    (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
          local_14a = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iVar3 = chdir(pcVar8);
        if (iVar3 < 0) {
          piVar5 = __errno_location();
          local_150 = *piVar5;
          local_171 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         in_stack_fffffffffffff920);
          cppcms_error::cppcms_error
                    (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
          local_171 = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
        pcVar8 = (char *)std::__cxx11::string::c_str();
        iVar3 = chroot(pcVar8);
        if (iVar3 < 0) {
          piVar5 = __errno_location();
          local_178 = *piVar5;
          local_199 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         in_stack_fffffffffffff920);
          cppcms_error::cppcms_error
                    (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
          local_199 = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
      }
      local_1a4 = 0xffffffff;
      local_1a0 = json::value::get<int>
                            (in_stack_fffffffffffff908,(char *)in_stack_fffffffffffff900,
                             (int *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      if (local_1a0 != -1) {
        local_1b8.rlim_cur = (rlim_t)local_1a0;
        local_1b8.rlim_max = (rlim_t)local_1a0;
        iVar3 = setrlimit(RLIMIT_NOFILE,&local_1b8);
        if (iVar3 < 0) {
          piVar5 = __errno_location();
          local_1bc = *piVar5;
          local_1e2 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1e0,"Failed to change daemon.fdlimit",&local_1e1);
          cppcms_error::cppcms_error
                    (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
          local_1e2 = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
      }
      if ((local_18 != 0xffffffff) && (iVar3 = setgid(local_18), iVar3 < 0)) {
        piVar5 = __errno_location();
        local_1e8 = *piVar5;
        local_209 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::operator+((char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                       in_stack_fffffffffffff920);
        cppcms_error::cppcms_error
                  (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
        local_209 = 0;
        __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      if ((local_1c != 0xffffffff) && (iVar3 = setuid(local_1c), iVar3 < 0)) {
        piVar5 = __errno_location();
        local_210 = *piVar5;
        local_231 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::operator+((char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                       in_stack_fffffffffffff920);
        cppcms_error::cppcms_error
                  (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
        local_231 = 0;
        __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      json::value::get_abi_cxx11_
                (in_stack_fffffffffffff948,
                 (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
                 in_stack_fffffffffffff938);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_258);
        if (*pcVar8 != '/') {
          local_260 = (char *)0x0;
          std::allocator<char>::allocator();
          std::vector<char,_std::allocator<char>_>::vector
                    (in_stack_fffffffffffff900,
                     CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                     in_stack_fffffffffffff8f0);
          std::allocator<char>::~allocator(&local_279);
          while( true ) {
            __buf = std::vector<char,_std::allocator<char>_>::front
                              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8e0);
            __size = std::vector<char,_std::allocator<char>_>::size(&local_278);
            local_260 = getcwd(__buf,__size);
            bVar1 = false;
            if (local_260 == (char *)0x0) {
              piVar5 = __errno_location();
              bVar1 = *piVar5 == 0x22;
            }
            if (!bVar1) break;
            std::vector<char,_std::allocator<char>_>::size(&local_278);
            std::vector<char,_std::allocator<char>_>::resize
                      (in_stack_fffffffffffff900,
                       CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
          }
          if (local_260 == (char *)0x0) {
            piVar5 = __errno_location();
            local_280 = *piVar5;
            local_2a2 = 1;
            uVar6 = __cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2a0,"getcwd failed",&local_2a1);
            cppcms_error::cppcms_error
                      (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950
                      );
            local_2a2 = 0;
            __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
          }
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                         in_stack_fffffffffffff920);
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         in_stack_fffffffffffff8e0);
          std::__cxx11::string::operator=(local_258,local_2c8);
          std::__cxx11::string::~string(local_2c8);
          std::__cxx11::string::~string(local_2e8);
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8f0);
        }
        pcVar8 = (char *)std::__cxx11::string::c_str();
        local_24 = open(pcVar8,0xc2,0x1b6);
        if (local_24 < 0) {
          piVar5 = __errno_location();
          local_2ec = *piVar5;
          local_312 = 1;
          uVar6 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_310,"Failed to create a lock file",&local_311);
          cppcms_error::cppcms_error
                    (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
          local_312 = 0;
          __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
        std::__cxx11::string::operator=((string *)(in_RDI + 2),local_258);
      }
      local_318 = fork();
      if (local_318 < 0) {
        piVar5 = __errno_location();
        local_31c = *piVar5;
        local_342 = 1;
        psVar9 = (string *)__cxa_allocate_exception(0x30);
        paVar11 = &local_341;
        iVar3 = local_31c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_340,"Fork failed",paVar11);
        cppcms_error::cppcms_error((cppcms_error *)paVar11,iVar3,psVar9);
        local_342 = 0;
        __cxa_throw(psVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      if (local_318 != 0) {
        exit(0);
      }
      _Var2 = getpid();
      *in_RDI = _Var2;
      _Var2 = setsid();
      if (_Var2 < 0) {
        piVar5 = __errno_location();
        local_348 = *piVar5;
        local_36a = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        paVar11 = &local_369;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_368,"setsid failed",paVar11);
        cppcms_error::cppcms_error
                  (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
        local_36a = 0;
        __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      local_318 = fork();
      if (local_318 < 0) {
        piVar5 = __errno_location();
        local_370 = *piVar5;
        local_392 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_390,"2nd fork failed",&local_391);
        cppcms_error::cppcms_error
                  (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950);
        local_392 = 0;
        __cxa_throw(uVar6,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      if (local_318 != 0) {
        exit(0);
      }
      _Var2 = getpid();
      *in_RDI = _Var2;
      dup2(local_20,0);
      dup2(local_20,1);
      dup2(local_20,2);
      close(local_20);
      local_20 = 0xffffffff;
      local_398 = chdir("/");
      if (local_24 != -1) {
        std::__cxx11::ostringstream::ostringstream(local_510);
        std::locale::classic();
        std::ios::imbue(local_518);
        std::locale::~locale(local_518);
        std::ostream::operator<<(local_510,*in_RDI);
        std::__cxx11::ostringstream::str();
        iVar3 = local_24;
        __buf_00 = (void *)std::__cxx11::string::c_str();
        __n = std::__cxx11::string::size();
        sVar10 = ::write(iVar3,__buf_00,__n);
        iVar3 = (int)sVar10;
        local_53c = iVar3;
        iVar4 = std::__cxx11::string::size();
        if (iVar3 != iVar4) {
          psVar9 = (string *)__cxa_allocate_exception(0x30);
          paVar11 = &local_561;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_560,"Failed to write to lock file",paVar11);
          cppcms_error::cppcms_error((cppcms_error *)paVar11,psVar9);
          __cxa_throw(psVar9,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
        }
        close(local_24);
        local_24 = -1;
        std::__cxx11::string::~string(local_538);
        std::__cxx11::ostringstream::~ostringstream(local_510);
      }
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_80);
    }
  }
  return;
}

Assistant:

void daemonizer::daemonize(json::value const &conf)
	{
		if(getppid() == 1)
			return;
		
		if(!conf.get("daemon.enable",false))
			return;
		
		int gid = -1;
		int uid = -1;
		
		int devnull_fd = -1;
		int lock_fd = -1;

		try {
		
			devnull_fd = open("/dev/null",O_RDWR);
			
			if(devnull_fd < 0) {
				int err = errno;
				throw cppcms_error(err,"Failed to open /dev/null");
			}
			
			std::string group = conf.get("daemon.group","");
			if(!group.empty()) {
				struct group *gr = getgrnam(group.c_str());
				if(!gr)
					throw cppcms_error("Invalid group " + group);
				gid = gr->gr_gid;
			}
			
			std::string user = conf.get("daemon.user","");
			if(!user.empty()) {
				struct passwd *pw = getpwnam(user.c_str());
				if(!pw)
					throw cppcms_error("Invalid user " + user);
				uid = pw->pw_uid;
				if(gid==-1)
					gid = pw->pw_gid;
			}
			
			std::string chroot_dir = conf.get("daemon.chroot","");

			if(!chroot_dir.empty()) {
				global_urandom_fd = open("/dev/urandom",O_RDONLY);
				if(global_urandom_fd < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to open /dev/urandom");
				}

				if(chdir(chroot_dir.c_str()) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to chdir to " + chroot_dir);
				}
				if(chroot(chroot_dir.c_str()) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to chroot to " + chroot_dir);
				}

			}

			int fd_limit = conf.get("daemon.fdlimit",-1);
			if(fd_limit != -1) {
				struct rlimit lm;
				lm.rlim_cur = fd_limit;
				lm.rlim_max = fd_limit;
				if(setrlimit(RLIMIT_NOFILE,&lm) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to change daemon.fdlimit");
				}
			}
			
			if(gid!=-1) {
				if(setgid(gid) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed setgid to group " + group);
				}
			}

			if(uid!=-1) {
				if(setuid(uid) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed setuid to user " + user);
				}
			}


			std::string lock_file = conf.get("daemon.lock","");
			if(!lock_file.empty()) {
				if(lock_file[0]!='/') {
					char *wd = 0;
					std::vector<char> buf(256);
					while((wd=getcwd(&buf.front(),buf.size()))==0 && errno==ERANGE)
						buf.resize(buf.size()*2);
					if(!wd) {
						int err=errno;
						throw cppcms_error(err,"getcwd failed");
					}
					lock_file=wd + ("/" + lock_file);
				}
				lock_fd = ::open(lock_file.c_str(),O_RDWR | O_CREAT | O_EXCL,0666);
				if(lock_fd < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to create a lock file");
				}
				unlink_file = lock_file;
			}

			// forking twice
			int chid = fork();
			if(chid < 0) {
				int err = errno;
				throw cppcms_error(err,"Fork failed");
			}
			if(chid != 0)
				exit(0);
			
			real_pid = getpid();
			
			if(setsid() < 0) {
				int err = errno;
				throw cppcms_error(err,"setsid failed");

			}
			chid = fork();
			if(chid < 0) {
				int err = errno;
				throw cppcms_error(err,"2nd fork failed");
			}
			if(chid != 0)
				exit(0);
			
			real_pid = getpid();

			dup2(devnull_fd,0);
			dup2(devnull_fd,1);
			dup2(devnull_fd,2);

			close(devnull_fd);
			devnull_fd = -1;

			int chdir_r = chdir("/");
			(void)(chdir_r); // shut up GCC

			if(lock_fd!=-1) {
				std::ostringstream ss;
				ss.imbue(std::locale::classic());
				ss << real_pid;
				std::string pid = ss.str();
				int v = write(lock_fd,pid.c_str(),pid.size());
				if(v!=int(pid.size())) {
					throw cppcms_error("Failed to write to lock file");
				}
				close(lock_fd);
				lock_fd = -1;
			}
		}
		catch(...) {
			if(lock_fd >= 0)
				close(lock_fd);
			if(devnull_fd >=0)
				close(devnull_fd);
			if(global_urandom_fd >= 0)
				close(global_urandom_fd);
			throw;
		}
	}